

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::StringAppend(VirtualMachine *this)

{
  string *psVar1;
  Variable VVar2;
  Variable VVar3;
  Variable var;
  string local_98;
  undefined8 local_68;
  undefined1 auStack_60 [8];
  string local_58;
  string *local_38;
  string *str;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  first.field_1.integerValue._0_4_ = VVar2.type;
  VVar3 = popOpStack(this);
  first._0_8_ = VVar3.field_1;
  str._0_4_ = VVar3.type;
  local_38 = Heap::NewString_abi_cxx11_(&this->heap);
  std::__cxx11::string::clear();
  psVar1 = local_38;
  local_68 = CONCAT44(str._4_4_,(VariableType)str);
  auStack_60 = (undefined1  [8])first._0_8_;
  VVar3._4_4_ = 0;
  VVar3.type = (VariableType)str;
  VVar3.field_1 = (anon_union_8_6_52c89740_for_Variable_1)first._0_8_;
  variableToString_abi_cxx11_((string *)(auStack_60 + 8),this,VVar3,true);
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)(auStack_60 + 8));
  psVar1 = local_38;
  var._4_4_ = 0;
  var.type = first.field_1.integerValue._0_4_;
  var.field_1.integerValue = VVar2.field_1.integerValue;
  variableToString_abi_cxx11_(&local_98,this,var,true);
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_98);
  pushString(this,local_38);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::StringAppend() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  auto str = this->heap.NewString();

  str->clear();

  str->append(this->variableToString(first, true));
  str->append(this->variableToString(second, true));

  this->pushString(str);
  this->advance();
}